

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

int cpu_restore_state_from_tb
              (CPUState *cpu,TranslationBlock_conflict *tb,uintptr_t searched_pc,_Bool reset_icount)

{
  ushort uVar1;
  target_long_conflict tVar2;
  uint32_t uVar3;
  CPUNegativeOffsetState_conflict5 *pCVar4;
  int local_50;
  int num_insns;
  int j;
  int i;
  uint8_t *p;
  CPUArchState_conflict28 *env;
  uintptr_t host_pc;
  target_ulong_conflict data [1];
  _Bool reset_icount_local;
  uintptr_t searched_pc_local;
  TranslationBlock_conflict *tb_local;
  CPUState *cpu_local;
  
  host_pc._0_4_ = tb->pc;
  env = (CPUArchState_conflict28 *)(tb->tc).ptr;
  p = (uint8_t *)cpu->env_ptr;
  _j = (uint8_t *)((long)(tb->tc).ptr + (tb->tc).size);
  uVar1 = tb->icount;
  _data = (CPUArchState_conflict28 *)(searched_pc - 2);
  if (env <= _data) {
    host_pc._7_1_ = reset_icount;
    for (num_insns = 0; num_insns < (int)(uint)uVar1; num_insns = num_insns + 1) {
      for (local_50 = 0; local_50 < 1; local_50 = local_50 + 1) {
        tVar2 = decode_sleb128((uint8_t **)&j);
        data[(long)local_50 + -2] = tVar2 + data[(long)local_50 + -2];
      }
      tVar2 = decode_sleb128((uint8_t **)&j);
      env = (CPUArchState_conflict28 *)((long)env->gpr_a + (long)tVar2);
      if (_data < env) {
        if (((host_pc._7_1_ & 1) != 0) && (uVar3 = tb_cflags(tb), (uVar3 & 0x20000) != 0)) {
          pCVar4 = cpu_neg(cpu);
          (pCVar4->icount_decr).u16.low = (pCVar4->icount_decr).u16.low + (uVar1 - (short)num_insns)
          ;
        }
        restore_state_to_opc_tricore((CPUTriCoreState *)p,tb,(target_ulong_conflict *)&host_pc);
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int cpu_restore_state_from_tb(CPUState *cpu, TranslationBlock *tb,
                                     uintptr_t searched_pc, bool reset_icount)
{
    target_ulong data[TARGET_INSN_START_WORDS] = { tb->pc };
    uintptr_t host_pc = (uintptr_t)tb->tc.ptr;
    CPUArchState *env = cpu->env_ptr;
    uint8_t *p = (uint8_t *)tb->tc.ptr + tb->tc.size;
    int i, j, num_insns = tb->icount;

    searched_pc -= GETPC_ADJ;

    if (searched_pc < host_pc) {
        return -1;
    }

    /* Reconstruct the stored insn data while looking for the point at
       which the end of the insn exceeds the searched_pc.  */
    for (i = 0; i < num_insns; ++i) {
        for (j = 0; j < TARGET_INSN_START_WORDS; ++j) {
            data[j] += decode_sleb128(&p);
        }
        host_pc += decode_sleb128(&p);
        if (host_pc > searched_pc) {
            goto found;
        }
    }
    return -1;

 found:
    if (reset_icount && (tb_cflags(tb) & CF_USE_ICOUNT)) {
        /* Reset the cycle counter to the start of the block
           and shift if to the number of actually executed instructions */
        cpu_neg(cpu)->icount_decr.u16.low += num_insns - i;
    }
    restore_state_to_opc(env, tb, data);

    return 0;
}